

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O1

void __thiscall
Diligent::RefCountersImpl::Attach<Diligent::DeviceContextVkImpl,Diligent::IMemoryAllocator>
          (RefCountersImpl *this,DeviceContextVkImpl *pObject,IMemoryAllocator *pAllocator)

{
  string msg;
  string local_40;
  
  if ((this->m_ObjectState)._M_i != NotInitialized) {
    FormatString<char[33]>(&local_40,(char (*) [33])"Object has already been attached");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Attach",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x10d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_ObjectWrapperBuffer[0] = (size_t)&PTR_DestroyObject_00935340;
  this->m_ObjectWrapperBuffer[1] = (size_t)pObject;
  this->m_ObjectWrapperBuffer[2] = (size_t)pAllocator;
  LOCK();
  (this->m_ObjectState)._M_i = Alive;
  UNLOCK();
  return;
}

Assistant:

void Attach(ObjectType* pObject, AllocatorType* pAllocator)
    {
        VERIFY(m_ObjectState.load() == ObjectState::NotInitialized, "Object has already been attached");
        static_assert(sizeof(ObjectWrapper<ObjectType, AllocatorType>) == sizeof(m_ObjectWrapperBuffer), "Unexpected object wrapper size");
        new (m_ObjectWrapperBuffer) ObjectWrapper<ObjectType, AllocatorType>{pObject, pAllocator};
        m_ObjectState.store(ObjectState::Alive);
    }